

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void plot_horizontal_tiles_common
               (tgestate_t *state,tileindex_t *vistiles,supertileindex_t *maptiles,uint8_t y,
               uint8_t *window)

{
  tile_t *ptVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  char cVar6;
  char cVar7;
  tileindex_t *ptVar8;
  tile_t *ptVar9;
  uint8_t *puVar10;
  long lVar11;
  
  uVar3 = (y & 3) << 2;
  ptVar8 = supertiles[*maptiles].tiles + ((state->map_position).x & 3 | uVar3);
  bVar2 = -(char)ptVar8 & 3;
  bVar5 = 4;
  if (bVar2 != 0) {
    bVar5 = bVar2;
  }
  ptVar1 = (tile_t *)0x110998;
  do {
    bVar2 = *ptVar8;
    *vistiles = bVar2;
    ptVar9 = ptVar1;
    if ((byte)(*maptiles + 0x34) < 0xbf) {
      ptVar9 = (tile_t *)0x1102b8;
    }
    if (*maptiles < 0x2d) {
      ptVar9 = exterior_tiles;
    }
    lVar11 = 0;
    puVar10 = window;
    do {
      *puVar10 = ptVar9[bVar2].row[lVar11];
      puVar10 = puVar10 + state->columns;
      lVar11 = lVar11 + 1;
    } while ((char)lVar11 != '\b');
    ptVar8 = ptVar8 + 1;
    vistiles = vistiles + 1;
    window = window + 1;
    bVar5 = bVar5 - 1;
  } while (bVar5 != 0);
  pbVar4 = maptiles + 1;
  bVar5 = (byte)uVar3;
  cVar6 = '\x05';
  do {
    ptVar8 = supertiles[*pbVar4].tiles + bVar5;
    cVar7 = '\x04';
    do {
      bVar2 = *ptVar8;
      *vistiles = bVar2;
      ptVar9 = ptVar1;
      if ((byte)(*pbVar4 + 0x34) < 0xbf) {
        ptVar9 = (tile_t *)0x1102b8;
      }
      if (*pbVar4 < 0x2d) {
        ptVar9 = exterior_tiles;
      }
      lVar11 = 0;
      puVar10 = window;
      do {
        *puVar10 = ptVar9[bVar2].row[lVar11];
        puVar10 = puVar10 + state->columns;
        lVar11 = lVar11 + 1;
      } while ((char)lVar11 != '\b');
      ptVar8 = ptVar8 + 1;
      vistiles = vistiles + 1;
      window = window + 1;
      cVar7 = cVar7 + -1;
    } while (cVar7 != '\0');
    pbVar4 = pbVar4 + 1;
    cVar6 = cVar6 + -1;
  } while (cVar6 != '\0');
  bVar2 = (state->map_position).x & 3;
  if (bVar2 != 0) {
    ptVar8 = supertiles[*pbVar4].tiles + bVar5;
    do {
      bVar5 = *ptVar8;
      *vistiles = bVar5;
      ptVar9 = ptVar1;
      if ((byte)(*pbVar4 + 0x34) < 0xbf) {
        ptVar9 = (tile_t *)0x1102b8;
      }
      if (*pbVar4 < 0x2d) {
        ptVar9 = exterior_tiles;
      }
      lVar11 = 0;
      puVar10 = window;
      do {
        *puVar10 = ptVar9[bVar5].row[lVar11];
        puVar10 = puVar10 + state->columns;
        lVar11 = lVar11 + 1;
      } while ((char)lVar11 != '\b');
      ptVar8 = ptVar8 + 1;
      vistiles = vistiles + 1;
      window = window + 1;
      bVar2 = bVar2 - 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

void plot_horizontal_tiles_common(tgestate_t             *state,
                                  tileindex_t            *vistiles,
                                  const supertileindex_t *maptiles,
                                  uint8_t                 y,
                                  uint8_t                *window)
{
  /* Conv: self_A86A removed. Can be replaced with pos_copy. */

  uint8_t            y_offset;  /* was Cdash */
  const tileindex_t *tiles;     /* was HL */
  uint8_t            A;         /* was A */
  uint8_t            iters;     /* was B */
  uint8_t            iters2;    /* was B' */
  uint8_t            offset;    // new or A' ?

  assert(state != NULL);
  ASSERT_TILE_BUF_PTR_VALID(vistiles);
  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  // assert(y);
  ASSERT_WINDOW_BUF_PTR_VALID(window, 0);

  y_offset = (y & 3) * 4;
  ASSERT_MAP_POSITION_VALID(state->map_position);
  offset = (state->map_position.x & 3) + y_offset;

  /* Initial edge. */

  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[offset];
  ASSERT_SUPERTILE_PTR_VALID(tiles);

  A = tiles - &supertiles[0].tiles[0]; // Conv: Original code could simply use L.

  // 0,1,2,3 => 4,3,2,1
  A = -A & 3;
  if (A == 0)
    A = 4;

  iters = A; /* 1..4 iterations */
  do
  {
    tileindex_t t; /* was A */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);

    // Conv: Fused accesses and increments.
    t = *vistiles++ = *tiles++; // A = tile index
    window = plot_tile(state, t, maptiles, window);
  }
  while (--iters);

  maptiles++;

  /* Middle loop. */

  iters2 = 5;
  do
  {
    ASSERT_MAP_BUF_PTR_VALID(maptiles);
    assert(*maptiles < supertileindex__LIMIT);
    tiles = &supertiles[*maptiles].tiles[y_offset]; // self modified by $A82A

    iters = 4;
    do
    {
      tileindex_t t; /* was A */

      ASSERT_TILE_BUF_PTR_VALID(vistiles);
      ASSERT_SUPERTILE_PTR_VALID(tiles);

      t = *vistiles++ = *tiles++; // A = tile index
      window = plot_tile(state, t, maptiles, window);
    }
    while (--iters);

    maptiles++;
  }
  while (--iters2);

  /* Trailing edge. */

  //A = pos_copy; // an apparently unused assignment

  ASSERT_MAP_BUF_PTR_VALID(maptiles);
  assert(*maptiles < supertileindex__LIMIT);
  tiles = &supertiles[*maptiles].tiles[y_offset]; // read of self modified instruction
  // Conv: A was A'.
  A = state->map_position.x & 3; // map_position lo (repeats earlier work)
  if (A == 0)
    return; /* can skip trailing edge */

  iters = A;
  do
  {
    tileindex_t t; /* was Adash */

    ASSERT_TILE_BUF_PTR_VALID(vistiles);
    ASSERT_SUPERTILE_PTR_VALID(tiles);

    t = *vistiles++ = *tiles++; // Adash = tile index
    window = plot_tile(state, t, maptiles, window);
  }
  while (--iters);
}